

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

void graph_5_4::prim_6(void)

{
  ps_int((int *)&DAT_001051f0,10);
  sort_5_4::merge_sort_1((int *)&DAT_001051f0,0,9);
}

Assistant:

void test() {
        int a[] = {12, 4, 16, 34, 6, 5, 8, 11, 38, 25};
        ps_int(a, 10);
//        bubble_sort_1(a, 10);
//        select_sort(a, 10);
//        insert_sort_1(a, 10);
//        insert_b_sort_1(a, 10);
//        shell_sort_1(a, 10);
//        quick_sort_1(a, 0, 10);
//        heap_sort_1(a, 10);
        merge_sort_1(a, 0, 9);
        ps_int(a, 10);
    }